

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  stbrp_node *psVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  stbrp_node **ppsVar10;
  long lVar11;
  stbrp_context *psVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  stbrp_context *in_R8;
  ulong uVar16;
  stbrp_context *psVar17;
  stbrp_node **ppsVar18;
  stbrp_context *psVar19;
  stbrp_rect *psVar20;
  uint local_98;
  uint local_94;
  stbrp_node **local_80;
  uint local_78;
  uint local_50;
  int waste;
  stbrp_node **local_48;
  size_t local_40;
  stbrp_rect *local_38;
  
  uVar9 = 0;
  uVar16 = 0;
  if (0 < num_rects) {
    uVar16 = (ulong)(uint)num_rects;
  }
  psVar12 = (stbrp_context *)&rects->was_packed;
  for (; uVar16 != uVar9; uVar9 = uVar9 + 1) {
    psVar12->width = (int)uVar9;
    psVar12 = (stbrp_context *)&psVar12->heuristic;
  }
  local_40 = (size_t)num_rects;
  ImQsort(rects,local_40,0x12e950,(_func_int_void_ptr_void_ptr *)psVar12);
  local_48 = &context->active_head;
  uVar9 = 0;
  local_38 = rects;
  do {
    if (uVar9 == uVar16) {
      ImQsort(rects,local_40,0x12e978,(_func_int_void_ptr_void_ptr *)psVar12);
      for (lVar11 = 0; uVar16 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        uVar14 = 1;
        if (*(short *)((long)&rects->x + lVar11) == -1) {
          uVar14 = (uint)(*(short *)((long)&rects->y + lVar11) != -1);
        }
        *(uint *)((long)&rects->was_packed + lVar11) = uVar14;
      }
      return (int)lVar11;
    }
    uVar1 = rects[uVar9].w;
    if (uVar1 == 0) {
LAB_0012a0f8:
      rects[uVar9].x = 0;
      rects[uVar9].y = 0;
    }
    else {
      uVar2 = rects[uVar9].h;
      psVar12 = (stbrp_context *)(ulong)uVar2;
      if (uVar2 == 0) goto LAB_0012a0f8;
      iVar13 = context->width;
      uVar14 = context->align;
      psVar12 = (stbrp_context *)(ulong)uVar14;
      iVar15 = uVar1 + uVar14 + -1;
      iVar15 = iVar15 - iVar15 % (int)uVar14;
      psVar20 = rects;
      if (iVar13 < iVar15) {
LAB_0012a26c:
        rects[uVar9].x = 0xffff;
        rects[uVar9].y = 0xffff;
        rects = psVar20;
      }
      else {
        iVar4 = context->height;
        local_78 = (uint)uVar2;
        if (iVar4 < (int)local_78) goto LAB_0012a26c;
        psVar19 = (stbrp_context *)*local_48;
        local_94 = 0x40000000;
        uVar14 = 0x40000000;
        local_80 = (stbrp_node **)0x0;
        psVar17 = psVar19;
        ppsVar18 = local_48;
        while( true ) {
          uVar3 = (ushort)psVar17->width;
          uVar8 = (uint)uVar2;
          if (iVar13 < (int)((uint)uVar3 + iVar15)) break;
          uVar6 = stbrp__skyline_find_min_y
                            (psVar17,(stbrp_node *)(ulong)uVar3,iVar15,(int)&waste,&in_R8->width);
          if (context->heuristic == 0) {
            psVar12 = context;
            if ((int)uVar6 < (int)uVar14) {
              uVar14 = uVar6;
              local_80 = ppsVar18;
            }
          }
          else {
            psVar12 = (stbrp_context *)(ulong)(uVar8 + uVar6);
            if ((int)(uVar8 + uVar6) <= iVar4) {
              psVar12 = (stbrp_context *)(ulong)(uint)waste;
              if (((int)uVar6 < (int)uVar14) || (waste < (int)local_94 && uVar6 == uVar14)) {
                local_94 = waste;
                uVar14 = uVar6;
                local_80 = ppsVar18;
              }
            }
          }
          ppsVar18 = (stbrp_node **)&psVar17->align;
          psVar17 = *(stbrp_context **)&psVar17->align;
        }
        if (local_80 == (stbrp_node **)0x0) {
          local_98 = 0;
        }
        else {
          local_98 = (uint)(*local_80)->x;
        }
        psVar17 = psVar19;
        if (context->heuristic == 1) {
          while (ppsVar18 = local_48, (int)(uint)(ushort)psVar17->width < iVar15) {
            psVar17 = *(stbrp_context **)&psVar17->align;
          }
          for (; psVar17 != (stbrp_context *)0x0; psVar17 = *(stbrp_context **)&psVar17->align) {
            uVar6 = (uint)(ushort)psVar17->width - iVar15;
            psVar12 = psVar19;
            do {
              psVar19 = psVar12;
              ppsVar10 = ppsVar18;
              ppsVar18 = (stbrp_node **)&psVar19->align;
              psVar12 = *(stbrp_context **)&psVar19->align;
            } while ((int)(uint)(ushort)(*(stbrp_context **)&psVar19->align)->width <= (int)uVar6);
            uVar7 = stbrp__skyline_find_min_y
                              (psVar19,(stbrp_node *)(ulong)uVar6,iVar15,(int)&local_50,
                               &in_R8->width);
            psVar12 = (stbrp_context *)(ulong)(uVar8 + uVar7);
            if ((((int)(uVar8 + uVar7) <= iVar4) && ((int)uVar7 <= (int)uVar14)) &&
               (((psVar12 = (stbrp_context *)(ulong)local_50, uVar7 < uVar14 ||
                 ((int)local_50 < (int)local_94)) ||
                ((local_50 == local_94 && ((int)uVar6 < (int)local_98)))))) {
              local_94 = local_50;
              uVar14 = uVar7;
              local_98 = uVar6;
              local_80 = ppsVar10;
            }
            ppsVar18 = ppsVar10;
          }
        }
        psVar20 = local_38;
        if (local_80 == (stbrp_node **)0x0) goto LAB_0012a26c;
        uVar8 = uVar8 + uVar14;
        if ((iVar4 < (int)uVar8) ||
           (psVar5 = context->free_head, psVar12 = (stbrp_context *)(ulong)uVar8,
           psVar5 == (stbrp_node *)0x0)) goto LAB_0012a26c;
        psVar5->x = (stbrp_coord)local_98;
        psVar5->y = (stbrp_coord)uVar8;
        context->free_head = psVar5->next;
        psVar19 = (stbrp_context *)*local_80;
        psVar12 = psVar19;
        if ((int)(uint)(ushort)psVar19->width < (int)local_98) {
          psVar12 = *(stbrp_context **)&psVar19->align;
          local_80 = (stbrp_node **)&psVar19->align;
        }
        *local_80 = psVar5;
        iVar13 = local_98 + uVar1;
        in_R8 = (stbrp_context *)(ulong)local_98;
        while ((psVar19 = *(stbrp_context **)&psVar12->align, psVar19 != (stbrp_context *)0x0 &&
               ((int)(uint)(ushort)psVar19->width <= iVar13))) {
          *(stbrp_node **)&psVar12->align = context->free_head;
          context->free_head = (stbrp_node *)psVar12;
          psVar12 = psVar19;
          in_R8 = context;
        }
        psVar5->next = (stbrp_node *)psVar12;
        if ((int)(uint)(ushort)psVar12->width < iVar13) {
          *(short *)&psVar12->width = (short)iVar13;
        }
        rects[uVar9].x = (stbrp_coord)local_98;
        rects[uVar9].y = (stbrp_coord)uVar14;
        rects = local_38;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}